

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Array<capnp::Text::Reader>::~Array(Array<capnp::Text::Reader> *this)

{
  Reader *pRVar1;
  size_t sVar2;
  
  pRVar1 = this->ptr;
  if (pRVar1 != (Reader *)0x0) {
    sVar2 = this->size_;
    this->ptr = (Reader *)0x0;
    this->size_ = 0;
    (**this->disposer->_vptr_ArrayDisposer)(this->disposer,pRVar1,0x10,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }